

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ProceduralBlockSyntax::isKind(SyntaxKind kind)

{
  if (((3 < kind - AlwaysBlock) && (kind != FinalBlock)) && (kind != InitialBlock)) {
    return false;
  }
  return true;
}

Assistant:

bool ProceduralBlockSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::InitialBlock:
            return true;
        default:
            return false;
    }
}